

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

bool __thiscall MPLSParser::parse(MPLSParser *this,char *fileName)

{
  bool bVar1;
  uint uVar2;
  uint8_t *buffer_00;
  ssize_t sVar3;
  size_t __nbytes;
  uint8_t *buffer;
  int64_t fileSize;
  undefined1 local_58 [8];
  File file;
  char *fileName_local;
  MPLSParser *this_local;
  
  file.m_pos = (int64_t)fileName;
  File::File((File *)local_58);
  __nbytes = 0;
  uVar2 = File::open((File *)local_58,(char *)file.m_pos,1);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = File::size((File *)local_58,(int64_t *)&buffer);
    if (bVar1) {
      buffer_00 = (uint8_t *)operator_new__(CONCAT44(buffer._4_4_,(uint)buffer));
      sVar3 = File::read((File *)local_58,(int)buffer_00,(void *)(ulong)(uint)buffer,__nbytes);
      if ((int)sVar3 == 0) {
        if (buffer_00 != (uint8_t *)0x0) {
          operator_delete__(buffer_00);
        }
        this_local._7_1_ = false;
      }
      else {
        parse(this,buffer_00,(uint)buffer);
        if (buffer_00 != (uint8_t *)0x0) {
          operator_delete__(buffer_00);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  fileSize._0_4_ = 1;
  File::~File((File *)local_58);
  return this_local._7_1_;
}

Assistant:

bool MPLSParser::parse(const char* fileName)
{
    File file;
    if (!file.open(fileName, File::ofRead))
        return false;
    int64_t fileSize;
    if (!file.size(&fileSize))
        return false;
    const auto buffer = new uint8_t[fileSize];
    if (!file.read(buffer, static_cast<uint32_t>(fileSize)))
    {
        delete[] buffer;
        return false;
    }
    try
    {
        parse(buffer, static_cast<int>(fileSize));
        delete[] buffer;
        return true;
    }
    catch (...)
    {
        delete[] buffer;
        return false;
    }
}